

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O1

reference __thiscall
absl::lts_20240722::container_internal::
raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20240722::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
::iterator::operator*(iterator *this)

{
  code *pcVar1;
  slot_type *psVar2;
  slot_type *psVar3;
  slot_type *psVar4;
  undefined1 auVar5 [16];
  slot_type *psVar6;
  slot_type *psVar7;
  bool bVar8;
  slot_type *psVar9;
  uint *in_RSI;
  iterator iVar10;
  
  pcVar1 = (code *)this->ctrl_;
  if (pcVar1 == (code *)0x0) {
    raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<int,std::__cxx11::string>,absl::lts_20240722::hash_internal::Hash<int>,std::equal_to<int>,std::allocator<std::pair<int_const,std::__cxx11::string>>>
    ::iterator::operator*((iterator *)this);
LAB_00194b21:
    raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<int,std::__cxx11::string>,absl::lts_20240722::hash_internal::Hash<int>,std::equal_to<int>,std::allocator<std::pair<int_const,std::__cxx11::string>>>
    ::iterator::operator*((iterator *)this);
  }
  else {
    if (pcVar1 == google::protobuf::internal::TypeCardToString_abi_cxx11_) goto LAB_00194b21;
    if (-1 < (char)*pcVar1) {
      return (reference)(this->field_1).slot_;
    }
  }
  raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<int,std::__cxx11::string>,absl::lts_20240722::hash_internal::Hash<int>,std::equal_to<int>,std::allocator<std::pair<int_const,std::__cxx11::string>>>
  ::iterator::operator*((iterator *)this);
  psVar2 = *(slot_type **)this;
  if ((psVar2 == (slot_type *)google::protobuf::internal::TypeCardToString_abi_cxx11_ ||
       psVar2 == (slot_type *)0x0) || (-1 < (char)*(code *)psVar2)) {
    psVar3 = *(slot_type **)in_RSI;
    if ((psVar3 != (slot_type *)google::protobuf::internal::TypeCardToString_abi_cxx11_ &&
         psVar3 != (slot_type *)0x0) && ((char)*(code *)psVar3 < '\0')) goto LAB_00194c1a;
    if (psVar2 == (slot_type *)google::protobuf::internal::TypeCardToString_abi_cxx11_ &&
        psVar3 == (slot_type *)google::protobuf::internal::TypeCardToString_abi_cxx11_) {
LAB_00194c0d:
      return (reference)CONCAT71((int7)((ulong)psVar2 >> 8),psVar2 == psVar3);
    }
    if ((psVar2 == (slot_type *)google::protobuf::internal::TypeCardToString_abi_cxx11_) ==
        (psVar3 == (slot_type *)google::protobuf::internal::TypeCardToString_abi_cxx11_)) {
      if (psVar2 == (slot_type *)0x0 || psVar3 == (slot_type *)0x0) goto LAB_00194c0d;
      if ((psVar3 == (slot_type *)&kSooControl) == (psVar2 == (slot_type *)&kSooControl)) {
        this = (iterator *)((anon_union_8_1_a8a14541_for_iterator_2 *)((long)this + 8))->slot_;
        psVar4 = *(slot_type **)(in_RSI + 2);
        if (psVar2 == (slot_type *)&kSooControl) {
          bVar8 = (slot_type *)this == psVar4;
        }
        else {
          psVar9 = psVar4;
          psVar6 = psVar3;
          psVar7 = (slot_type *)this;
          if (psVar3 < psVar2) {
            psVar9 = (slot_type *)this;
            psVar6 = psVar2;
            psVar7 = psVar4;
          }
          in_RSI = (uint *)CONCAT71((int7)((ulong)psVar6 >> 8),psVar6 < psVar7);
          bVar8 = psVar7 <= psVar9 && psVar6 < psVar7;
        }
        if (bVar8) goto LAB_00194c0d;
      }
      goto LAB_00194c24;
    }
  }
  else {
    container_internal::operator==();
LAB_00194c1a:
    container_internal::operator==();
  }
  container_internal::operator==();
LAB_00194c24:
  container_internal::operator==();
  AssertHashEqConsistent<int>
            ((raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20240722::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)this,(int *)in_RSI);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = (long)&hash_internal::MixingHashState::kSeed + (ulong)*in_RSI;
  iVar10 = find_non_soo<int>((raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20240722::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)this,(key_arg<int> *)in_RSI,
                             SUB168(auVar5 * ZEXT816(0x9ddfea08eb382d69),8) ^
                             SUB168(auVar5 * ZEXT816(0x9ddfea08eb382d69),0));
  return (reference)iVar10.ctrl_;
}

Assistant:

reference operator*() const {
      AssertIsFull(ctrl_, generation(), generation_ptr(), "operator*()");
      return unchecked_deref();
    }